

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceMeanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemean(NeuralNetworkLayer *this)

{
  ReduceMeanLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x500) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x500;
    this_00 = (ReduceMeanLayerParams *)operator_new(0x30);
    ReduceMeanLayerParams::ReduceMeanLayerParams(this_00);
    (this->layer_).reducemean_ = this_00;
  }
  return (ReduceMeanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMeanLayerParams* NeuralNetworkLayer::mutable_reducemean() {
  if (!has_reducemean()) {
    clear_layer();
    set_has_reducemean();
    layer_.reducemean_ = new ::CoreML::Specification::ReduceMeanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMean)
  return layer_.reducemean_;
}